

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::ScanInitialImplicitRoots
          (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *this,Recycler *recycler)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  undefined4 *puVar4;
  code *pcVar5;
  BOOLEAN BVar6;
  bool bVar7;
  uint uVar8;
  ulong byteCount;
  BVIndex i;
  void **obj;
  ulong uVar9;
  long lVar10;
  undefined8 *in_FS_OFFSET;
  
  uVar8 = (uint)(this->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).super_HeapBlock.
                heapBlockType;
  if ((9 < uVar8) || ((0x252U >> (uVar8 & 0x1f) & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)*in_FS_OFFSET;
    *puVar4 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBlock.cpp"
                       ,0x50,"(this->IsAnyNormalBlock())","this->IsAnyNormalBlock()");
    if (!bVar7) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar4 = 0;
  }
  uVar1 = (this->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).objectCount;
  uVar9 = (ulong)uVar1;
  uVar2 = (this->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).objectSize;
  byteCount = (ulong)uVar2;
  uVar3 = (this->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).markCount;
  if ((uVar3 == uVar1) && (recycler->objectGraphDumper == (RecyclerObjectGraphDumper *)0x0)) {
    Recycler::ScanObjectInlineInterior
              (recycler,(void **)(this->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).
                                 super_HeapBlock.address,byteCount * uVar9);
    return;
  }
  if (uVar9 != 0 && uVar3 != 0) {
    i = 0;
    lVar10 = 0;
    do {
      BVar6 = BVStatic<2048UL>::Test
                        ((this->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).markBits,i);
      if (BVar6 != '\0') {
        obj = (void **)((this->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).
                        super_HeapBlock.address + lVar10);
        if (recycler->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
          RecyclerObjectGraphDumper::BeginDumpObject(recycler->objectGraphDumper,L"Implicit Root");
        }
        if (recycler->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
          RecyclerObjectGraphDumper::DumpObjectReference(recycler->objectGraphDumper,obj,false);
        }
        if (recycler->objectGraphDumper != (RecyclerObjectGraphDumper *)0x0) {
          RecyclerObjectGraphDumper::EndDumpObject(recycler->objectGraphDumper);
        }
        Recycler::ScanObjectInlineInterior(recycler,obj,byteCount);
      }
      lVar10 = lVar10 + byteCount;
      i = i + (uVar2 >> 4);
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  return;
}

Assistant:

void
SmallNormalHeapBlockT<TBlockAttributes>::ScanInitialImplicitRoots(Recycler * recycler)
{
    Assert(this->IsAnyNormalBlock());

    uint const localObjectCount = this->objectCount;
    uint const localObjectSize = this->GetObjectSize();

    // We can use the markCount to optimize the scan because we update it in ResetMark
    if (this->markCount == localObjectCount
#ifdef RECYCLER_DUMP_OBJECT_GRAPH
        && recycler->objectGraphDumper == nullptr
#endif
        )
    {
        // TODO: only interior?
        recycler->ScanObjectInlineInterior((void **)this->GetAddress(), localObjectSize * localObjectCount);
    }
    else if (this->markCount != 0)
    {
        uint const localObjectBitDelta = this->GetObjectBitDelta();
        for (uint i = 0; i < localObjectCount; i++)
        {
            if (this->GetMarkedBitVector()->Test(i * localObjectBitDelta))
            {
                // TODO: only interior?
                void ** address = (void **)(this->GetAddress() + i * localObjectSize);
                DUMP_IMPLICIT_ROOT(recycler, address);
                recycler->ScanObjectInlineInterior(address, localObjectSize);
            }
        }
    }
}